

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oprom.c
# Opt level: O0

int igsc_image_oprom_type(igsc_oprom_image *img,uint32_t *oprom_type)

{
  igsc_oprom_type iVar1;
  igsc_oprom_type img_type;
  uint32_t *oprom_type_local;
  igsc_oprom_image *img_local;
  
  if ((img == (igsc_oprom_image *)0x0) || (oprom_type == (uint32_t *)0x0)) {
    img_local._4_4_ = 3;
  }
  else {
    iVar1 = image_oprom_get_type(img);
    if (iVar1 == IGSC_OPROM_NONE) {
      img_local._4_4_ = 5;
    }
    else {
      *oprom_type = iVar1;
      img_local._4_4_ = 0;
    }
  }
  return img_local._4_4_;
}

Assistant:

int igsc_image_oprom_type(IN struct igsc_oprom_image *img,
                          OUT uint32_t *oprom_type)
{
    enum igsc_oprom_type img_type;

    if (img == NULL || oprom_type == NULL)
    {
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    img_type = image_oprom_get_type(img);
    if (img_type == IGSC_OPROM_NONE)
    {
        return IGSC_ERROR_BAD_IMAGE;
    }

    *oprom_type = img_type;

    return IGSC_SUCCESS;
}